

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symlink.cpp
# Opt level: O3

bool fs_create_symlink(string_view target,string_view link)

{
  string_view path;
  bool bVar1;
  size_t sVar2;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  string_view path1;
  string_view path2;
  string_view fname;
  int local_a0;
  char *pcVar3;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  path local_70;
  path local_48;
  
  local_a0 = 0;
  pcVar3 = in_RDX;
  local_80._M_len = in_RDI;
  local_80._M_str = in_RSI;
  sVar2 = std::_V2::system_category();
  if ((in_RDI == 0) || (in_RDX == (char *)0x0)) {
    std::_V2::generic_category();
    local_a0 = 0x16;
  }
  else {
    path._M_str = pcVar3;
    path._M_len = sVar2;
    bVar1 = fs_is_dir(path);
    if (bVar1) {
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_70,&local_80,auto_format);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_48,
                 (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff70,
                 auto_format);
      std::filesystem::create_directory_symlink(&local_70,&local_48,(error_code *)&local_a0);
      in_RDX = pcVar3;
    }
    else {
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_70,&local_80,auto_format);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_48,
                 (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff70,
                 auto_format);
      std::filesystem::create_symlink(&local_70,&local_48,(error_code *)&local_a0);
      in_RDX = pcVar3;
    }
    std::filesystem::__cxx11::path::~path(&local_48);
    std::filesystem::__cxx11::path::~path(&local_70);
    in_RSI = local_80._M_str;
    in_RDI = local_80._M_len;
    if (local_a0 == 0) {
      return true;
    }
  }
  path1._M_str = in_RSI;
  path1._M_len = in_RDI;
  path2._M_str = in_RCX;
  path2._M_len = (size_t)in_RDX;
  fname._M_str = "fs_create_symlink";
  fname._M_len = 0x11;
  fs_print_error(path1,path2,fname,(error_code *)&local_a0);
  return false;
}

Assistant:

bool fs_create_symlink(std::string_view target, std::string_view link)
{
  // create symlink to file or directory

  std::error_code ec;

  // confusing program errors if target is "" -- we'd never make such a symlink in real use.
  // macOS needs empty check to avoid SIGABRT

  if(target.empty() || link.empty()) FFS_UNLIKELY
    ec = std::make_error_code(std::errc::invalid_argument);
  else {
#if defined(__MINGW32__) || (defined(_WIN32) && !defined(HAVE_CXX_FILESYSTEM))

  DWORD p = SYMBOLIC_LINK_FLAG_ALLOW_UNPRIVILEGED_CREATE;

  if(fs_is_dir(target.data()))
    p |= SYMBOLIC_LINK_FLAG_DIRECTORY;

  if(CreateSymbolicLinkA(link.data(), target.data(), p))  FFS_LIKELY
    return true;

#elif defined(HAVE_CXX_FILESYSTEM)

  fs_is_dir(target)
    ? std::filesystem::create_directory_symlink(target, link, ec)
    : std::filesystem::create_symlink(target, link, ec);

  if(!ec) FFS_LIKELY
    return true;

#else
  // https://developer.apple.com/library/archive/documentation/System/Conceptual/ManPages_iPhoneOS/man2/symlink.2.html
  // https://linux.die.net/man/3/symlink
  if(symlink(target.data(), link.data()) == 0)  FFS_LIKELY
    return true;
#endif
  }

  fs_print_error(target, link, __func__, ec);
  return false;
}